

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

int __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Skip
          (CopyingFileInputStream *this,int count)

{
  LogMessage *other;
  __off_t _Var1;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  int local_1c;
  CopyingFileInputStream *pCStack_18;
  int count_local;
  CopyingFileInputStream *this_local;
  
  local_59 = 0;
  local_1c = count;
  pCStack_18 = this;
  if ((this->is_closed_ & 1U) != 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0x9a);
    local_59 = 1;
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: !is_closed_: ");
    internal::LogFinisher::operator=(local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (((this->previous_seek_failed_ & 1U) == 0) &&
     (_Var1 = lseek(this->file_,(long)local_1c,1), _Var1 != -1)) {
    this_local._4_4_ = local_1c;
  }
  else {
    this->previous_seek_failed_ = true;
    this_local._4_4_ = CopyingInputStream::Skip(&this->super_CopyingInputStream,local_1c);
  }
  return this_local._4_4_;
}

Assistant:

int FileInputStream::CopyingFileInputStream::Skip(int count) {
  GOOGLE_CHECK(!is_closed_);

  if (!previous_seek_failed_ &&
      lseek(file_, count, SEEK_CUR) != (off_t)-1) {
    // Seek succeeded.
    return count;
  } else {
    // Failed to seek.

    // Note to self:  Don't seek again.  This file descriptor doesn't
    // support it.
    previous_seek_failed_ = true;

    // Use the default implementation.
    return CopyingInputStream::Skip(count);
  }
}